

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IntegerTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntegerTypeSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,Token *args_2,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_3)

{
  size_t sVar1;
  pointer ppVVar2;
  Info *pIVar3;
  Info *pIVar4;
  SyntaxNode *pSVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  IntegerTypeSyntax *pIVar15;
  long lVar16;
  
  pIVar15 = (IntegerTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IntegerTypeSyntax *)this->endPtr < pIVar15 + 1) {
    pIVar15 = (IntegerTypeSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pIVar15 + 1);
  }
  TVar6 = args_1->kind;
  uVar7 = args_1->field_0x2;
  NVar8.raw = (args_1->numFlags).raw;
  uVar9 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar10 = args_2->kind;
  uVar11 = args_2->field_0x2;
  NVar12.raw = (args_2->numFlags).raw;
  uVar13 = args_2->rawLen;
  pIVar4 = args_2->info;
  (pIVar15->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = *args;
  (pIVar15->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0
  ;
  (pIVar15->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pIVar15->keyword).kind = TVar6;
  (pIVar15->keyword).field_0x2 = uVar7;
  (pIVar15->keyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pIVar15->keyword).rawLen = uVar9;
  (pIVar15->keyword).info = pIVar3;
  (pIVar15->signing).kind = TVar10;
  (pIVar15->signing).field_0x2 = uVar11;
  (pIVar15->signing).numFlags = (NumericTokenFlags)NVar12.raw;
  (pIVar15->signing).rawLen = uVar13;
  (pIVar15->signing).info = pIVar4;
  (pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_3->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar14 = *(undefined4 *)&(args_3->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (args_3->super_SyntaxListBase).super_SyntaxNode.parent;
  (pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_3->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar14;
  (pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar5;
  (pIVar15->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (pIVar15->dimensions).super_SyntaxListBase.childCount = (args_3->super_SyntaxListBase).childCount;
  sVar1 = (args_3->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pIVar15->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_ptr = (args_3->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
            _M_ptr;
  (pIVar15->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_extent._M_extent_value = sVar1;
  (pIVar15->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f88b8;
  (pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pIVar15;
  sVar1 = (pIVar15->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppVVar2 = (pIVar15->dimensions).
              super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar16 = 0;
    do {
      *(IntegerTypeSyntax **)(*(long *)((long)ppVVar2 + lVar16) + 8) = pIVar15;
      lVar16 = lVar16 + 8;
    } while (sVar1 << 3 != lVar16);
  }
  return pIVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }